

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.h
# Opt level: O0

int InitMS580314BA(MS580314BA *pMS580314BA)

{
  int iVar1;
  uint8 local_1d [5];
  MS580314BA *pMStack_18;
  uint8 writebuf [5];
  MS580314BA *pMS580314BA_local;
  
  builtin_memcpy(local_1d,"Z\x02 ",4);
  local_1d[4] = 0x19;
  pMStack_18 = pMS580314BA;
  iVar1 = WriteAllRS232Port(&pMS580314BA->RS232Port,local_1d,5);
  if (iVar1 == 0) {
    mSleep(10);
  }
  else {
    printf("Error writing data to a MS580314BA. \n");
  }
  pMS580314BA_local._4_4_ = (uint)(iVar1 != 0);
  return pMS580314BA_local._4_4_;
}

Assistant:

inline int InitMS580314BA(MS580314BA* pMS580314BA)
{
	uint8 writebuf[5];
	
	// Sequence for I2c and serial communication
	writebuf[0] = (uint8)0x5A; // start configuration
	writebuf[1] = (uint8)0x02; // iss mode
	writebuf[2] = (uint8)0x20; // I2C_S_20KHZ
	writebuf[3] = (uint8)0x00; // (115200)
	writebuf[4] = (uint8)0x19; // Baudrate

	if (WriteAllRS232Port(&pMS580314BA->RS232Port, writebuf, 5) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a MS580314BA. \n");
		return EXIT_FAILURE;
	}
	
	mSleep(10);

	return EXIT_SUCCESS;
}